

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O1

wchar_t borg_min_item_quantity(borg_item_conflict *item)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  bool bVar4;
  
  bVar3 = 1;
  if (((0xf9 < borg.trait[0x2d]) && (item->value < 6)) && (item->aware == true)) {
    if (item->tval - 2 < 3) {
      bVar1 = item->iqty;
      bVar4 = bVar1 < 5;
      bVar3 = 5;
    }
    else {
      if (item->tval != 0x1c) goto LAB_00243e18;
      uVar2 = item->iqty;
      bVar4 = (byte)uVar2 < 3;
      bVar3 = 3;
      bVar1 = uVar2;
    }
    if (bVar4) {
      bVar3 = bVar1;
    }
  }
LAB_00243e18:
  return (wchar_t)bVar3;
}

Assistant:

int borg_min_item_quantity(borg_item *item)
{
    /* Only trade in bunches if sufficient cash */
    if (borg.trait[BI_GOLD] < 250)
        return 1;

    /* Don't trade expensive items in bunches */
    if (item->value > 5)
        return 1;

    /* Don't trade non-known items in bunches */
    if (!item->aware)
        return 1;

    /* Only allow some types */
    switch (item->tval) {
    case TV_SHOT:
    case TV_ARROW:
    case TV_BOLT:
        /* Maximum number of items */
        if (item->iqty < 5)
            return (item->iqty);
        return 5;

    case TV_FOOD:
        if (item->iqty < 3)
            return (item->iqty);
        return 3;
#if 0
    case TV_POTION:
    case TV_SCROLL:
    if (item->iqty < 2)
        return (item->iqty);
    return 2;
#endif

    default:
        return 1;
    }
}